

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ModSystem.cpp
# Opt level: O0

ModGroup * __thiscall
RenX_ModSystemPlugin::getGroupByName
          (RenX_ModSystemPlugin *this,string_view name,ModGroup *defaultGroup)

{
  bool bVar1;
  reference pMVar2;
  ModGroup *pMVar3;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  ModGroup *group;
  const_iterator __end1;
  const_iterator __begin1;
  list<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_> *__range1;
  ModGroup *defaultGroup_local;
  RenX_ModSystemPlugin *this_local;
  string_view name_local;
  
  rhs._M_len = name._M_str;
  pMVar3 = defaultGroup;
  __end1 = std::__cxx11::
           list<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>::
           begin(&this->groups);
  group = (ModGroup *)
          std::__cxx11::
          list<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>::end
                    (&this->groups);
  while( true ) {
    bVar1 = std::operator==(&__end1,(_Self *)&group);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return defaultGroup;
    }
    pMVar2 = std::_List_const_iterator<RenX_ModSystemPlugin::ModGroup>::operator*(&__end1);
    rhs._M_str = &pMVar3->lockSteam;
    bVar1 = jessilib::equalsi<char,char>
                      ((jessilib *)&pMVar2->name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       name._M_len,rhs);
    if (bVar1) break;
    std::_List_const_iterator<RenX_ModSystemPlugin::ModGroup>::operator++(&__end1);
  }
  return pMVar2;
}

Assistant:

RenX_ModSystemPlugin::ModGroup *RenX_ModSystemPlugin::getGroupByName(std::string_view name, ModGroup *defaultGroup) const {
	for (const auto& group : groups) {
		if (jessilib::equalsi(group.name, name)) {
			return const_cast<ModGroup*>(&group);
		}
	}

	return defaultGroup;
}